

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3MaxLevel(Fts3Table *p,int *pnMax)

{
  int iVar1;
  sqlite3_stmt *local_28;
  sqlite3_stmt *pStmt;
  int mxLevel;
  int rc;
  int *pnMax_local;
  Fts3Table *p_local;
  
  pStmt._0_4_ = 0;
  local_28 = (sqlite3_stmt *)0x0;
  _mxLevel = pnMax;
  pnMax_local = (int *)p;
  pStmt._4_4_ = fts3SqlStmt(p,0x24,&local_28,(sqlite3_value **)0x0);
  if (pStmt._4_4_ == 0) {
    iVar1 = sqlite3_step(local_28);
    if (iVar1 == 100) {
      pStmt._0_4_ = sqlite3_column_int(local_28,0);
    }
    pStmt._4_4_ = sqlite3_reset(local_28);
  }
  *_mxLevel = (int)pStmt;
  return pStmt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MaxLevel(Fts3Table *p, int *pnMax){
  int rc;
  int mxLevel = 0;
  sqlite3_stmt *pStmt = 0;

  rc = fts3SqlStmt(p, SQL_SELECT_MXLEVEL, &pStmt, 0);
  if( rc==SQLITE_OK ){
    if( SQLITE_ROW==sqlite3_step(pStmt) ){
      mxLevel = sqlite3_column_int(pStmt, 0);
    }
    rc = sqlite3_reset(pStmt);
  }
  *pnMax = mxLevel;
  return rc;
}